

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O0

int IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub
              (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA_conflict *upload_data,
              char *destinationFileName,char **correlationId,char **sasUri)

{
  bool bVar1;
  int iVar2;
  STRING_HANDLE handle;
  LOGGER_LOG p_Var3;
  STRING_HANDLE handle_00;
  size_t sVar4;
  uchar *puVar5;
  BUFFER_HANDLE blobBuffer_00;
  BUFFER_HANDLE response_buff;
  HTTPAPIEX_HANDLE http_api_handle;
  HTTP_HEADERS_HANDLE request_header;
  STRING_HANDLE handle_01;
  char *pcVar6;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  STRING_HANDLE responseAsString;
  size_t responseContent_length;
  uchar *responseContent_u_char;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  _Bool wasIoTHubRequestSuccess;
  LOGGER_LOG l_5;
  HTTP_HEADERS_HANDLE iotHubRequestHttpHeaders;
  LOGGER_LOG l_4;
  HTTPAPIEX_HANDLE iotHubHttpApiExHandle;
  LOGGER_LOG l_3;
  BUFFER_HANDLE responseContent;
  LOGGER_LOG l_2;
  BUFFER_HANDLE blobBuffer;
  size_t blobNameLength;
  LOGGER_LOG l_1;
  STRING_HANDLE blobName;
  LOGGER_LOG l;
  STRING_HANDLE relativePath;
  int result;
  char **sasUri_local;
  char **correlationId_local;
  char *destinationFileName_local;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA_conflict *upload_data_local;
  
  handle = STRING_construct_sprintf
                     ("/devices/%s/files/%s",upload_data->deviceId,"?api-version=2016-11-14");
  if (handle == (STRING_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",0x1dc,1,
                "Failure constructing string");
    }
    relativePath._4_4_ = 0x1dd;
  }
  else {
    handle_00 = STRING_construct_sprintf("{ \"blobName\": \"%s\" }",destinationFileName);
    if (handle_00 == (STRING_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                  ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",0x1e5,1,
                  "Failure constructing string");
      }
      relativePath._4_4_ = 0x1e6;
    }
    else {
      sVar4 = STRING_length(handle_00);
      puVar5 = (uchar *)STRING_c_str(handle_00);
      blobBuffer_00 = BUFFER_create(puVar5,sVar4);
      if (blobBuffer_00 == (BUFFER_HANDLE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",0x1f2,1,
                    "unable to create BUFFER");
        }
        relativePath._4_4_ = 499;
      }
      else {
        response_buff = BUFFER_new();
        if (response_buff == (BUFFER_HANDLE)0x0) {
          relativePath._4_4_ = 0x1fb;
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                      ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",0x1fc,1,
                      "unable to BUFFER_new");
          }
        }
        else {
          http_api_handle = createIotHubHttpApiExHandle(upload_data);
          if (http_api_handle == (HTTPAPIEX_HANDLE)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                        ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",0x204,1,
                        "Failed to create the HTTPAPIEX_HANDLE for Azure IoT Hub");
            }
            relativePath._4_4_ = 0x205;
          }
          else {
            request_header = createIotHubRequestHttpHeaders(upload_data);
            if (request_header == (HTTP_HEADERS_HANDLE)0x0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                          ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",0x20d,1,
                          "Failed to allocate HTTP headers for IoT Hub connection");
              }
              relativePath._4_4_ = 0x20e;
            }
            else {
              bVar1 = false;
              if (upload_data->cred_type == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY) {
                pcVar6 = STRING_c_str(handle);
                iVar2 = send_http_sas_request
                                  (upload_data,http_api_handle,pcVar6,request_header,blobBuffer_00,
                                   response_buff);
                if (iVar2 == 0) {
                  bVar1 = true;
                }
                else {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                              ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",0x22e,1,
                              "unable to HTTPAPIEX_SAS_ExecuteRequest");
                  }
                }
              }
              else if (upload_data->cred_type - IOTHUB_CREDENTIAL_TYPE_X509 < 4) {
                pcVar6 = STRING_c_str(handle);
                iVar2 = send_http_request(http_api_handle,pcVar6,request_header,blobBuffer_00,
                                          response_buff);
                if (iVar2 == 0) {
                  bVar1 = true;
                }
                else {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                              ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",0x222,1,
                              "unable to HTTPAPIEX_ExecuteRequest");
                  }
                }
              }
              else {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                            ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",0x218,1,
                            "Internal Error: unexpected value in auth schema = %d",
                            upload_data->cred_type);
                }
              }
              if (bVar1) {
                puVar5 = BUFFER_u_char(response_buff);
                sVar4 = BUFFER_length(response_buff);
                handle_01 = STRING_from_byte_array(puVar5,sVar4);
                if (handle_01 == (STRING_HANDLE)0x0) {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                              ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",0x240,1,
                              "unable to get the response as string");
                  }
                  relativePath._4_4_ = 0x241;
                }
                else {
                  pcVar6 = STRING_c_str(handle_01);
                  iVar2 = parseResultFromIoTHub(pcVar6,correlationId,sasUri);
                  if (iVar2 == 0) {
                    relativePath._4_4_ = 0;
                  }
                  else {
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",0x247,1
                                ,"unable to parse json result");
                    }
                    relativePath._4_4_ = 0x248;
                  }
                  STRING_delete(handle_01);
                }
              }
              else {
                relativePath._4_4_ = 0x254;
              }
              HTTPHeaders_Free(request_header);
            }
            HTTPAPIEX_Destroy(http_api_handle);
          }
          BUFFER_delete(response_buff);
        }
        BUFFER_delete(blobBuffer_00);
      }
      STRING_delete(handle_00);
    }
    STRING_delete(handle);
  }
  return relativePath._4_4_;
}

Assistant:

static int IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub(
    IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA* upload_data, const char* destinationFileName, char** correlationId, char** sasUri)
{
    int result;
    STRING_HANDLE relativePath = STRING_construct_sprintf("/devices/%s/files/%s", upload_data->deviceId, API_VERSION);

    if (relativePath == NULL)
    {
        LogError("Failure constructing string");
        result = MU_FAILURE;
    }
    else
    {
        STRING_HANDLE blobName = STRING_construct_sprintf("{ \"blobName\": \"%s\" }", destinationFileName);

        if (blobName == NULL)
        {
            LogError("Failure constructing string");
            result = MU_FAILURE;
        }
        else
        {
            // Keep STRING_length separate in an separate call to avoid messing up with unit tests.
            // For details, see function parameter evaluation order (C99 6.5.2.2p10).
            size_t blobNameLength = STRING_length(blobName);
            BUFFER_HANDLE blobBuffer = BUFFER_create(
                (const unsigned char *)STRING_c_str(blobName), blobNameLength);

            if (blobBuffer == NULL)
            {
                LogError("unable to create BUFFER");
                result = MU_FAILURE;
            }
            else
            {
                BUFFER_HANDLE responseContent;

                if ((responseContent = BUFFER_new()) == NULL)
                {
                    result = MU_FAILURE;
                    LogError("unable to BUFFER_new");
                }
                else
                {
                    HTTPAPIEX_HANDLE iotHubHttpApiExHandle = createIotHubHttpApiExHandle(upload_data);

                    if (iotHubHttpApiExHandle == NULL)
                    {
                        LogError("Failed to create the HTTPAPIEX_HANDLE for Azure IoT Hub");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        HTTP_HEADERS_HANDLE iotHubRequestHttpHeaders;

                        if ((iotHubRequestHttpHeaders = createIotHubRequestHttpHeaders(upload_data)) == NULL)
                        {
                            LogError("Failed to allocate HTTP headers for IoT Hub connection");
                            result = MU_FAILURE;
                        }
                        else
                        {
                            bool wasIoTHubRequestSuccess = false;

                            switch (upload_data->cred_type)
                            {
                                default:
                                {
                                    LogError("Internal Error: unexpected value in auth schema = %d", upload_data->cred_type);
                                    break;
                                }
                                case IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN:
                                case IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH:
                                case IOTHUB_CREDENTIAL_TYPE_X509_ECC:
                                case IOTHUB_CREDENTIAL_TYPE_X509:
                                {
                                    if (send_http_request(iotHubHttpApiExHandle, STRING_c_str(relativePath), iotHubRequestHttpHeaders, blobBuffer, responseContent) != 0)
                                    {
                                        LogError("unable to HTTPAPIEX_ExecuteRequest");
                                    }
                                    else
                                    {
                                        wasIoTHubRequestSuccess = true;
                                    }
                                    break;
                                }
                                case IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY:
                                {
                                    if (send_http_sas_request(upload_data, iotHubHttpApiExHandle, STRING_c_str(relativePath), iotHubRequestHttpHeaders, blobBuffer, responseContent) != 0)
                                    {
                                        LogError("unable to HTTPAPIEX_SAS_ExecuteRequest");
                                    }
                                    else
                                    {
                                        wasIoTHubRequestSuccess = true;
                                    }

                                    break;
                                }
                            }

                            if (wasIoTHubRequestSuccess)
                            {
                                const unsigned char* responseContent_u_char = BUFFER_u_char(responseContent);
                                size_t responseContent_length = BUFFER_length(responseContent);
                                STRING_HANDLE responseAsString = STRING_from_byte_array(responseContent_u_char, responseContent_length);
                                if (responseAsString == NULL)
                                {
                                    LogError("unable to get the response as string");
                                    result = MU_FAILURE;
                                }
                                else
                                {
                                    if (parseResultFromIoTHub(STRING_c_str(responseAsString), correlationId, sasUri) != 0)
                                    {
                                        LogError("unable to parse json result");
                                        result = MU_FAILURE;
                                    }
                                    else
                                    {
                                        result = 0;
                                    }

                                    STRING_delete(responseAsString);
                                }
                            }
                            else
                            {
                                result = MU_FAILURE;
                            }

                            HTTPHeaders_Free(iotHubRequestHttpHeaders);
                        }

                        HTTPAPIEX_Destroy(iotHubHttpApiExHandle);
                    }

                    BUFFER_delete(responseContent);
                }

                BUFFER_delete(blobBuffer);
            }

            STRING_delete(blobName);
        }

        STRING_delete(relativePath);
    }

    return result;
}